

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Unmarshall.c
# Opt level: O0

WJTL_STATUS TestUnmarshallStructFixArray(void)

{
  JL_STATUS JVar1;
  int iVar2;
  bool bVar3;
  _Bool _result_9;
  _Bool _result_8;
  _Bool _result_7;
  _Bool _result_6;
  _Bool _result_5;
  _Bool _result_4;
  _Bool _result_3;
  _Bool _result_2;
  _Bool _result_1;
  _Bool _result;
  TheStruct theStruct;
  JlMarshallElement marshalTheStruct [1];
  JlMarshallElement marshalMiniStruct [2];
  size_t errorAtPos;
  WJTL_STATUS TestReturn;
  
  errorAtPos._4_4_ = WJTL_STATUS_SUCCESS;
  marshalMiniStruct[1].ChildStructDescriptionCount = 0;
  marshalMiniStruct[1]._92_4_ = 0;
  memcpy(&marshalTheStruct[0].ChildStructDescriptionCount,&DAT_0014f470,0xc0);
  theStruct.StructFixArrayCount._0_4_ = 5;
  marshalTheStruct[0]._0_8_ = anon_var_dwarf_8a40;
  marshalTheStruct[0].Name._0_1_ = 1;
  marshalTheStruct[0].IsArray = false;
  marshalTheStruct[0]._17_7_ = 0;
  marshalTheStruct[0].FieldOffset = 0x40;
  marshalTheStruct[0].FieldSize = 0x40;
  marshalTheStruct[0].CountFieldOffset = 8;
  marshalTheStruct[0].CountFieldSize = 0x40;
  marshalTheStruct[0].ArrayFieldSize = 0x10;
  marshalTheStruct[0].ArrayItemSize._0_4_ = 0;
  marshalTheStruct[0].ArrayItemSize._4_1_ = 0;
  marshalTheStruct[0].ArrayItemSize._5_1_ = 0;
  marshalTheStruct[0]._72_8_ = &marshalTheStruct[0].ChildStructDescriptionCount;
  marshalTheStruct[0].ChildStructDescription._0_4_ = 2;
  memset(&_result_7,0,0x48);
  JVar1 = JlJsonToStruct("{ \"MiniFixList\": [ {\"XNum\":501,\"XStr\":\"501\"}, {\"XNum\":601,\"XStr\":\"601\"} ] }"
                         ,(JlMarshallElement *)&theStruct.StructFixArrayCount,1,&_result_7,
                         (size_t *)&marshalMiniStruct[1].ChildStructDescriptionCount);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlJsonToStruct( \"{ \\\"MiniFixList\\\": [ {\\\"XNum\\\":501,\\\"XStr\\\":\\\"501\\\"}, {\\\"XNum\\\":601,\\\"XStr\\\":\\\"601\\\"} ] }\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallStructFixArray",0x548);
  if (JVar1 != JL_STATUS_SUCCESS) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = marshalMiniStruct[1]._88_8_ == 0;
  WjTestLib_Assert(bVar3,"0 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallStructFixArray",0x549);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(theStruct.StructFixArray[3].XStr == (char *)0x2,
                   "2 == theStruct.StructFixArrayCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallStructFixArray",0x54b);
  if (theStruct.StructFixArray[3].XStr != (char *)0x2) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(__result_7 == 0x1f5,"501 == theStruct.StructFixArray[0].XNum",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallStructFixArray",0x54c);
  if (__result_7 != 0x1f5) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  iVar2 = strcmp((char *)theStruct.StructFixArray[0].XNum,"501");
  WjTestLib_Assert(iVar2 == 0,"strcmp( theStruct.StructFixArray[0].XStr, \"501\" ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallStructFixArray",0x54d);
  if (iVar2 != 0) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(theStruct.StructFixArray[0].XStr == (char *)0x259,
                   "601 == theStruct.StructFixArray[1].XNum",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallStructFixArray",0x54e);
  if (theStruct.StructFixArray[0].XStr != (char *)0x259) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  iVar2 = strcmp((char *)theStruct.StructFixArray[1].XNum,"601");
  WjTestLib_Assert(iVar2 == 0,"strcmp( theStruct.StructFixArray[1].XStr, \"601\" ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallStructFixArray",0x54f);
  if (iVar2 != 0) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  JVar1 = JlUnmarshallFreeStructAllocs
                    ((JlMarshallElement *)&theStruct.StructFixArrayCount,1,&_result_7);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlUnmarshallFreeStructAllocs( marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallStructFixArray",0x551);
  if (JVar1 != JL_STATUS_SUCCESS) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  JVar1 = JlJsonToStruct("{ \"MiniFixList\": [ {\"XNum\":501,\"XStr\":\"501\"}, {\"XNum\":601,\"XStr\":\"601\"},{\"XNum\":701,\"XStr\":\"701\"}, {\"XNum\":801,\"XStr\":\"801\"},{\"XNum\":901,\"XStr\":\"901\"} ] }"
                         ,(JlMarshallElement *)&theStruct.StructFixArrayCount,1,&_result_7,
                         (size_t *)&marshalMiniStruct[1].ChildStructDescriptionCount);
  WjTestLib_Assert(JVar1 == JL_STATUS_TOO_MANY_ITEMS,
                   "(JlJsonToStruct( \"{ \\\"MiniFixList\\\": [ {\\\"XNum\\\":501,\\\"XStr\\\":\\\"501\\\"}, {\\\"XNum\\\":601,\\\"XStr\\\":\\\"601\\\"},\" \"{\\\"XNum\\\":701,\\\"XStr\\\":\\\"701\\\"}, {\\\"XNum\\\":801,\\\"XStr\\\":\\\"801\\\"},{\\\"XNum\\\":901,\\\"XStr\\\":\\\"901\\\"} ] }\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos )) == (JL_STATUS_TOO_MANY_ITEMS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallStructFixArray",0x557);
  if (JVar1 != JL_STATUS_TOO_MANY_ITEMS) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = marshalMiniStruct[1]._88_8_ == 0x11;
  WjTestLib_Assert(bVar3,"17 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallStructFixArray",0x558);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  return errorAtPos._4_4_;
}

Assistant:

static
WJTL_STATUS
    TestUnmarshallStructFixArray
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;
    size_t errorAtPos = 0;

    typedef struct
    {
        uint64_t    XNum;
        char*       XStr;
    } MiniStruct;

    typedef struct
    {
        MiniStruct  StructFixArray[4];
        size_t      StructFixArrayCount;
    } TheStruct;

    JlMarshallElement marshalMiniStruct[] = {
        JlMarshallUnsigned( MiniStruct, XNum, "XNum" ),
        JlMarshallString( MiniStruct, XStr, "XStr" ),
    };

    JlMarshallElement marshalTheStruct[] = {
        JlMarshallStructFixedArray( TheStruct, StructFixArray, StructFixArrayCount, "MiniFixList", MiniStruct, marshalMiniStruct, NumElements(marshalMiniStruct) ),
    };

    TheStruct theStruct = {{{0}}};

    // Fill in struct with values
    JL_ASSERT_SUCCESS( JlJsonToStruct(
        "{ \"MiniFixList\": [ {\"XNum\":501,\"XStr\":\"501\"}, {\"XNum\":601,\"XStr\":\"601\"} ] }",
            marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
    JL_ASSERT( 0 == errorAtPos );

    JL_ASSERT( 2 == theStruct.StructFixArrayCount );
    JL_ASSERT( 501 == theStruct.StructFixArray[0].XNum );
    JL_ASSERT( strcmp( theStruct.StructFixArray[0].XStr, "501" ) == 0 );
    JL_ASSERT( 601 == theStruct.StructFixArray[1].XNum );
    JL_ASSERT( strcmp( theStruct.StructFixArray[1].XStr, "601" ) == 0 );

    JL_ASSERT_SUCCESS( JlUnmarshallFreeStructAllocs( marshalTheStruct, NumElements(marshalTheStruct), &theStruct ) );

    // Try with too much data
    JL_ASSERT_STATUS( JlJsonToStruct(
        "{ \"MiniFixList\": [ {\"XNum\":501,\"XStr\":\"501\"}, {\"XNum\":601,\"XStr\":\"601\"},"
        "{\"XNum\":701,\"XStr\":\"701\"}, {\"XNum\":801,\"XStr\":\"801\"},{\"XNum\":901,\"XStr\":\"901\"} ] }",
            marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ), JL_STATUS_TOO_MANY_ITEMS );
    JL_ASSERT( 17 == errorAtPos );

    return TestReturn;
}